

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_closure.cpp
# Opt level: O3

void __thiscall main::f::exec(f *this)

{
  vector<int,std::allocator<int>> *this_00;
  iterator __position;
  
  printf("ref.total %d i %d\n",(ulong)(uint)*(this->ref).total,(ulong)(uint)this->i);
  pthread_mutex_lock((pthread_mutex_t *)(this->ref).m);
  this_00 = (vector<int,std::allocator<int>> *)(this->ref).v2;
  __position._M_current = *(int **)(this_00 + 8);
  if (__position._M_current == *(int **)(this_00 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_00,__position,&this->i)
    ;
  }
  else {
    *__position._M_current = this->i;
    *(int **)(this_00 + 8) = __position._M_current + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this->ref).m);
  return;
}

Assistant:

co_func( f,ref,i )
		{
			printf("ref.total %d i %d\n",ref.total,i );
			//lock
			pthread_mutex_lock(&ref.m);
			ref.v2.push_back( i );
			pthread_mutex_unlock(&ref.m);
			//unlock
		}